

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O3

void __thiscall xray_re::cse_alife_human_abstract::state_read(cse_alife_human_abstract *this)

{
  xr_packet *in_RSI;
  
  state_read((cse_alife_human_abstract *)&this[-1].super_cse_alife_monster_abstract.m_next_graph_id,
             in_RSI,0);
  return;
}

Assistant:

void cse_alife_human_abstract::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_trader_abstract::state_read(packet, size);
	cse_alife_monster_abstract::state_read(packet, size);
	if (m_version > CSE_VERSION_0x13) {
		if (m_version < CSE_VERSION_0x6e) {
			for (uint_fast32_t n = packet.r_u32(); n; --n)	// m_tpPath
				packet.r_u32();
			packet.r_u32();				// m_baVisitedVertices
		}
		if (m_version > CSE_VERSION_0x23) {
			if (m_version < CSE_VERSION_0x6e)
				packet.skip_sz();		// m_caKnownCustomers
			if (m_version < CSE_VERSION_0x76) {
				for (uint_fast32_t n = packet.r_u32(); n; --n)	// m_tpKnownCustomers
					packet.r_u32();
			}
		}
		if (!packet.is_ini()) {
			packet.r_seq(packet.r_u32(), m_equipment_preferences);
			if (m_equipment_preferences.size() != 5)
				msg("wrong size equipment_preferences %" PRIuSIZET ", expected %d %s (%s)", m_equipment_preferences.size(), 5, name_replace().c_str(),
					name().c_str());
			packet.r_seq(packet.r_u32(), m_main_weapon_preferences);
			if (m_main_weapon_preferences.size() != 4)
				msg("wrong size main_weapon_preferences %" PRIuSIZET ", expected %d %s (%s)", m_main_weapon_preferences.size(), 4, name_replace().c_str(),
					name().c_str());
		}
	}
	if (m_version >= CSE_VERSION_0x6e && m_version < 0x70)
		packet.r_u16(m_smart_terrain_id);
}